

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::PskcTest_InvalidArgs_PassphraseIsTooLong_Test::
~PskcTest_InvalidArgs_PassphraseIsTooLong_Test(PskcTest_InvalidArgs_PassphraseIsTooLong_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(PskcTest, InvalidArgs_PassphraseIsTooLong)
{
    const std::string passphrase(256, '1');
    const std::string networkName   = "Test Network";
    const ByteArray   extendedPanId = {0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07};
    ByteArray         pskc;

    EXPECT_EQ(Commissioner::GeneratePSKc(pskc, passphrase, networkName, extendedPanId).GetCode(),
              ErrorCode::kInvalidArgs);
}